

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_ManGetClpStats_rec(Cba_Ntk_t *p,int *pCountN,int *pCountI,int *pCountO)

{
  long lVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  int iVar6;
  Cba_Ntk_t *p_00;
  long lVar7;
  long lVar8;
  
  iVar3 = p->Id;
  if (pCountN[iVar3] < 0) {
    pCountO[iVar3] = 0;
    pCountI[iVar3] = 0;
    pCountN[iVar3] = 0;
    if (1 < (p->vObjType).nSize) {
      lVar7 = 1;
      do {
        if ((p->vObjType).nSize <= lVar7) {
LAB_003ac028:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        cVar2 = (p->vObjType).pArray[lVar7];
        if (cVar2 != '\0') {
          if ((byte)(cVar2 + 0xa6U) < 0xaa) {
            if (cVar2 != '\x03') goto LAB_003abfe9;
            if ((p->vObjFunc).nSize < 1) {
              lVar8 = 0;
            }
            else {
              Vec_IntFillExtra(&p->vObjFunc,(int)lVar7 + 1,0);
              if ((p->vObjFunc).nSize <= lVar7) goto LAB_003ac009;
              lVar8 = (long)(p->vObjFunc).pArray[lVar7];
            }
            if ((p->vObjType).nSize <= lVar7) goto LAB_003ac028;
            uVar4 = 0;
            if (((p->vObjType).pArray[lVar7] == '\x03') && (uVar4 = 0, 0 < (p->vObjFunc).nSize)) {
              Vec_IntFillExtra(&p->vObjFunc,(int)lVar7 + 1,0);
              if ((p->vObjFunc).nSize <= lVar7) goto LAB_003ac009;
              uVar4 = (p->vObjFunc).pArray[lVar7];
            }
            if (((int)uVar4 < 1) || ((p->pDesign->vNtks).nSize <= (int)uVar4)) {
              p_00 = (Cba_Ntk_t *)0x0;
            }
            else {
              p_00 = (Cba_Ntk_t *)(p->pDesign->vNtks).pArray[uVar4];
            }
            Cba_ManGetClpStats_rec(p_00,pCountN,pCountI,pCountO);
            lVar1 = lVar7 + 1;
            if ((p->vObjFon0).nSize <= lVar1) {
LAB_003ac009:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            piVar5 = (p->vObjFon0).pArray;
            pCountN[iVar3] = pCountN[iVar3] + ((piVar5[lVar7 + 1] + pCountN[lVar8]) - piVar5[lVar7])
            ;
            if ((p->vObjFon0).nSize <= lVar1) goto LAB_003ac009;
            pCountI[iVar3] = pCountI[iVar3] + ((piVar5[lVar7 + 1] + pCountI[lVar8]) - piVar5[lVar7])
            ;
            if ((p->vObjFon0).nSize <= lVar1) goto LAB_003ac009;
            iVar6 = piVar5[lVar7 + 1] + pCountO[lVar8];
          }
          else {
            pCountN[iVar3] = pCountN[iVar3] + 1;
            if (((long)(p->vObjFin0).nSize <= lVar7 + 1) ||
               (piVar5 = (p->vObjFin0).pArray,
               pCountI[iVar3] = pCountI[iVar3] + (piVar5[lVar7 + 1] - piVar5[lVar7]),
               (long)(p->vObjFon0).nSize <= lVar7 + 1)) goto LAB_003ac009;
            piVar5 = (p->vObjFon0).pArray;
            iVar6 = piVar5[lVar7 + 1];
          }
          pCountO[iVar3] = (iVar6 - piVar5[lVar7]) + pCountO[iVar3];
        }
LAB_003abfe9:
        lVar7 = lVar7 + 1;
      } while (lVar7 < (p->vObjType).nSize);
    }
  }
  return;
}

Assistant:

void Cba_ManGetClpStats_rec( Cba_Ntk_t * p, int * pCountN, int * pCountI, int * pCountO )
{
    int iObj, Id = Cba_NtkId(p);
    if ( pCountN[Id] >= 0 )
        return;
    pCountN[Id] = pCountI[Id] = pCountO[Id] = 0;
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim(p, iObj) )
        {
            pCountN[Id] += 1;
            pCountI[Id] += Cba_ObjFinNum(p, iObj);
            pCountO[Id] += Cba_ObjFonNum(p, iObj);
        }
        else if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            int NtkId = Cba_ObjNtkId(p, iObj);
            Cba_ManGetClpStats_rec( Cba_ObjNtk(p, iObj), pCountN, pCountI, pCountO );
            pCountN[Id] += pCountN[NtkId] + Cba_ObjFonNum(p, iObj);
            pCountI[Id] += pCountI[NtkId] + Cba_ObjFonNum(p, iObj);
            pCountO[Id] += pCountO[NtkId] + Cba_ObjFonNum(p, iObj);
        }
}